

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio.hpp
# Opt level: O0

bool __thiscall ELFIO::elfio::load_sections(elfio *this,istream *stream,bool is_lazy)

{
  char *__s;
  long lVar1;
  istream *piVar2;
  int iVar3;
  pointer peVar4;
  undefined4 extraout_var;
  section *psVar5;
  streamoff sVar6;
  undefined4 extraout_var_00;
  allocator<char> local_a9;
  string local_a8 [32];
  char *local_88;
  char *p;
  Elf_Word section_offset;
  Elf_Half i_1;
  string_section_accessor str_reader;
  undefined8 uStack_68;
  Elf_Half shstrndx;
  fpos<__mbstate_t> local_60;
  fpos<__mbstate_t> local_50;
  section *local_40;
  section *sec;
  long lStack_30;
  Elf_Half i;
  Elf64_Off offset;
  Elf_Half num;
  Elf_Half entry_size;
  uchar file_class;
  istream *piStack_20;
  bool is_lazy_local;
  istream *stream_local;
  elfio *this_local;
  
  offset._7_1_ = is_lazy;
  piStack_20 = stream;
  stream_local = (istream *)this;
  peVar4 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar3 = (*peVar4->_vptr_elf_header[4])();
  offset._6_1_ = (char)iVar3;
  peVar4 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar3 = (*peVar4->_vptr_elf_header[8])();
  offset._4_2_ = (ushort)iVar3;
  peVar4 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar3 = (*peVar4->_vptr_elf_header[0x18])();
  offset._2_2_ = (ushort)iVar3;
  peVar4 = std::unique_ptr<ELFIO::elf_header,_std::default_delete<ELFIO::elf_header>_>::operator->
                     (&this->header);
  iVar3 = (*peVar4->_vptr_elf_header[0x1a])();
  lStack_30 = CONCAT44(extraout_var,iVar3);
  if ((((offset._2_2_ == 0) || (offset._6_1_ != '\x02')) || (0x3f < offset._4_2_)) &&
     (((offset._2_2_ == 0 || (offset._6_1_ != '\x01')) || (0x27 < offset._4_2_)))) {
    for (sec._6_2_ = 0; sec._6_2_ < offset._2_2_; sec._6_2_ = sec._6_2_ + 1) {
      psVar5 = create_section(this);
      piVar2 = piStack_20;
      lVar1 = lStack_30;
      local_40 = psVar5;
      std::fpos<__mbstate_t>::fpos(&local_60,(ulong)sec._6_2_);
      sVar6 = std::fpos::operator_cast_to_long((fpos *)&local_60);
      std::fpos<__mbstate_t>::fpos(&local_50,lVar1 + sVar6 * (ulong)offset._4_2_);
      (*psVar5->_vptr_section[0x24])
                (psVar5,piVar2,local_50._M_off,local_50._M_state,(ulong)(offset._7_1_ & 1));
      psVar5 = local_40;
      iVar3 = (*local_40->_vptr_section[0x11])();
      uStack_68 = CONCAT44(extraout_var_00,iVar3);
      (*psVar5->_vptr_section[0x12])(psVar5,&stack0xffffffffffffff98);
    }
    str_reader.string_section._6_2_ = get_section_name_str_index(this);
    if (str_reader.string_section._6_2_ != 0) {
      psVar5 = Sections::operator[](&this->sections,(uint)str_reader.string_section._6_2_);
      string_section_accessor_template<ELFIO::section>::string_section_accessor_template
                ((string_section_accessor_template<ELFIO::section> *)&section_offset,psVar5);
      for (p._6_2_ = 0; p._6_2_ < offset._2_2_; p._6_2_ = p._6_2_ + 1) {
        psVar5 = Sections::operator[](&this->sections,(uint)p._6_2_);
        p._0_4_ = (*psVar5->_vptr_section[0x15])();
        local_88 = string_section_accessor_template<ELFIO::section>::get_string
                             ((string_section_accessor_template<ELFIO::section> *)&section_offset,
                              (Elf_Word)p);
        if (local_88 != (char *)0x0) {
          psVar5 = Sections::operator[](&this->sections,(uint)p._6_2_);
          __s = local_88;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>(local_a8,__s,&local_a9);
          (*psVar5->_vptr_section[4])(psVar5,local_a8);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator(&local_a9);
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool load_sections( std::istream& stream, bool is_lazy )
    {
        unsigned char file_class = header->get_class();
        Elf_Half      entry_size = header->get_section_entry_size();
        Elf_Half      num        = header->get_sections_num();
        Elf64_Off     offset     = header->get_sections_offset();

        if ( ( num != 0 && file_class == ELFCLASS64 &&
               entry_size < sizeof( Elf64_Shdr ) ) ||
             ( num != 0 && file_class == ELFCLASS32 &&
               entry_size < sizeof( Elf32_Shdr ) ) ) {
            return false;
        }

        for ( Elf_Half i = 0; i < num; ++i ) {
            section* sec = create_section();

            // Load return value is ignored here
            // This allows retrieval of information from corrupted sections
            sec->load( stream,
                       static_cast<std::streamoff>( offset ) +
                           static_cast<std::streampos>( i ) * entry_size,
                       is_lazy );
            // To mark that the section is not permitted to reassign address
            // during layout calculation
            sec->set_address( sec->get_address() );
        }

        if ( Elf_Half shstrndx = get_section_name_str_index();
             SHN_UNDEF != shstrndx ) {
            string_section_accessor str_reader( sections[shstrndx] );
            for ( Elf_Half i = 0; i < num; ++i ) {
                Elf_Word section_offset = sections[i]->get_name_string_offset();
                const char* p = str_reader.get_string( section_offset );
                if ( p != nullptr ) {
                    sections[i]->set_name( p );
                }
            }
        }

        return true;
    }